

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::FormattingScene::~FormattingScene(FormattingScene *this)

{
  FormattingScene *in_RDI;
  
  ~FormattingScene(in_RDI);
  operator_delete(in_RDI,0xd8);
  return;
}

Assistant:

FormattingScene::~FormattingScene() {
    if (errorExit)
        ErrorExit("Fatal errors during scene updating.");
}